

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O0

uint8_t * bstr_match_cstr(uint8_t *pBegin,uint8_t *pEnd,char *cstr)

{
  int *piVar1;
  size_t sVar2;
  uint8_t *pStrEnd;
  uint8_t *pStrBegin;
  char *cstr_local;
  uint8_t *pEnd_local;
  uint8_t *pBegin_local;
  
  if ((((pBegin == (uint8_t *)0x0) || (pEnd == (uint8_t *)0x0)) || (pEnd < pBegin)) ||
     (cstr == (char *)0x0)) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    pBegin_local = (uint8_t *)0x0;
  }
  else {
    sVar2 = strlen(cstr);
    pBegin_local = bstr_match_bstr(pBegin,pEnd,(uint8_t *)cstr,(uint8_t *)(cstr + sVar2));
  }
  return pBegin_local;
}

Assistant:

const uint8_t *bstr_match_cstr(const uint8_t *pBegin, const uint8_t *pEnd, const char *cstr)
{
   const uint8_t *pStrBegin = (const uint8_t*) cstr;
   const uint8_t *pStrEnd;
   if ( (pBegin == 0) || (pEnd == 0) || (pEnd < pBegin) || (cstr == 0) )
   {
      errno = EINVAL; //invalid arguments
      return 0;
   }
   pStrEnd = pStrBegin + strlen(cstr);
   return bstr_match_bstr(pBegin, pEnd, pStrBegin, pStrEnd);
}